

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.cc
# Opt level: O3

ostream * absl::lts_20240722::time_internal::cctz::detail::operator<<(ostream *os,weekday wd)

{
  long lVar1;
  char *pcVar2;
  
  switch(wd) {
  case monday:
    pcVar2 = "Monday";
    goto LAB_00101a3f;
  case tuesday:
    pcVar2 = "Tuesday";
    lVar1 = 7;
    break;
  case wednesday:
    pcVar2 = "Wednesday";
    lVar1 = 9;
    break;
  case thursday:
    pcVar2 = "Thursday";
    goto LAB_00101a31;
  case friday:
    pcVar2 = "Friday";
    goto LAB_00101a3f;
  case saturday:
    pcVar2 = "Saturday";
LAB_00101a31:
    lVar1 = 8;
    break;
  case sunday:
    pcVar2 = "Sunday";
LAB_00101a3f:
    lVar1 = 6;
    break;
  default:
    goto switchD_001019f1_default;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,pcVar2,lVar1);
switchD_001019f1_default:
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, weekday wd) {
  switch (wd) {
    case weekday::monday:
      return os << "Monday";
    case weekday::tuesday:
      return os << "Tuesday";
    case weekday::wednesday:
      return os << "Wednesday";
    case weekday::thursday:
      return os << "Thursday";
    case weekday::friday:
      return os << "Friday";
    case weekday::saturday:
      return os << "Saturday";
    case weekday::sunday:
      return os << "Sunday";
  }
  return os;  // Should never get here, but -Wreturn-type may warn without this.
}